

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kiste2cpp.cpp
# Opt level: O1

segment_t *
kiste::parse_expression(segment_t *__return_storage_ptr__,string *line,segment_type type,size_t pos)

{
  char cVar1;
  bool bVar2;
  runtime_error *this;
  char cVar3;
  int iVar4;
  string expression;
  undefined1 *local_50;
  long local_48;
  undefined1 local_40;
  undefined7 uStack_3f;
  
  local_50 = &local_40;
  local_48 = 0;
  local_40 = 0;
  bVar2 = true;
  if (pos < line->_M_string_length) {
    iVar4 = 1;
    do {
      cVar1 = (line->_M_dataplus)._M_p[pos];
      cVar3 = (char)&local_50;
      if (cVar1 == '{') {
        std::__cxx11::string::push_back(cVar3);
        iVar4 = iVar4 + 1;
      }
      else if (cVar1 == '}') {
        iVar4 = iVar4 + -1;
        if (iVar4 == 0) {
          iVar4 = 0;
        }
        else {
          std::__cxx11::string::push_back(cVar3);
        }
      }
      else {
        std::__cxx11::string::push_back(cVar3);
      }
      pos = pos + 1;
    } while ((pos < line->_M_string_length) && (iVar4 != 0));
    bVar2 = 0 < iVar4;
  }
  if (!bVar2) {
    __return_storage_ptr__->_end_pos = pos - 1;
    __return_storage_ptr__->_type = type;
    (__return_storage_ptr__->_text)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->_text).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->_text,local_50,local_50 + local_48);
    if (local_50 != &local_40) {
      operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
    }
    return __return_storage_ptr__;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,"missing closing brace");
  *(undefined ***)this = &PTR__runtime_error_0010cd88;
  __cxa_throw(this,&parse_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

auto parse_expression(const std::string& line, segment_type type, std::size_t pos) -> segment_t
  {
    auto expression = std::string{};
    auto arg_curly_level = 1;

    for (; pos < line.size() and arg_curly_level; ++pos)
    {
      switch (line.at(pos))
      {
      case '{':
        ++arg_curly_level;
        expression.push_back(line.at(pos));
        break;
      case '}':
        --arg_curly_level;
        if (arg_curly_level)
        {
          expression.push_back(line.at(pos));
        }
        else
        {
          // do nothing, as this probably the closing curly brace of the command
        }
        break;
      default:
        expression.push_back(line.at(pos));
      }
    }
    if (arg_curly_level > 0)
    {
      throw parse_error("missing closing brace");
    }
    --pos;

    return {pos, type, expression};
  }